

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtSat.c
# Opt level: O0

int Cgt_CheckImplication(Cgt_Man_t *p,Aig_Obj_t *pGate,Aig_Obj_t *pMiter)

{
  int *piVar1;
  int iVar2;
  int c;
  Aig_Obj_t *pAVar3;
  abctime aVar4;
  abctime aVar5;
  abctime clk;
  int RetValue;
  int pLits [2];
  int nBTLimit;
  Aig_Obj_t *pMiter_local;
  Aig_Obj_t *pGate_local;
  Cgt_Man_t *p_local;
  
  pLits[0] = p->pPars->nConfMax;
  p->nCalls = p->nCalls + 1;
  unique0x10000364 = pMiter;
  if ((p->pSat == (sat_solver *)0x0) || (p->pCnf == (Cnf_Dat_t *)0x0)) {
    __assert_fail("p->pSat && p->pCnf",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cgt/cgtSat.c"
                  ,0x36,"int Cgt_CheckImplication(Cgt_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  iVar2 = Aig_IsComplement(pMiter);
  if (iVar2 != 0) {
    __assert_fail("!Aig_IsComplement(pMiter)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cgt/cgtSat.c"
                  ,0x37,"int Cgt_CheckImplication(Cgt_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  pAVar3 = Aig_Regular(pGate);
  if (pAVar3 != stack0xffffffffffffffd8) {
    piVar1 = p->pCnf->pVarNums;
    pAVar3 = Aig_Regular(pGate);
    iVar2 = piVar1[pAVar3->Id];
    c = Aig_IsComplement(pGate);
    clk._4_4_ = toLitCond(iVar2,c);
    RetValue = toLitCond(p->pCnf->pVarNums[stack0xffffffffffffffd8->Id],0);
    aVar4 = Abc_Clock();
    clk._0_4_ = sat_solver_solve(p->pSat,(lit *)((long)&clk + 4),pLits,(long)pLits[0],0,0,0);
    aVar5 = Abc_Clock();
    p->timeSat = (aVar5 - aVar4) + p->timeSat;
    if ((int)clk == -1) {
      aVar5 = Abc_Clock();
      p->timeSatUnsat = (aVar5 - aVar4) + p->timeSatUnsat;
      clk._4_4_ = lit_neg(clk._4_4_);
      RetValue = lit_neg(RetValue);
      clk._0_4_ = sat_solver_addclause(p->pSat,(lit *)((long)&clk + 4),pLits);
      if ((int)clk == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cgt/cgtSat.c"
                      ,0x48,"int Cgt_CheckImplication(Cgt_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
      }
      sat_solver_compress(p->pSat);
      p->nCallsUnsat = p->nCallsUnsat + 1;
      p_local._4_4_ = 1;
    }
    else if ((int)clk == 1) {
      aVar5 = Abc_Clock();
      p->timeSatSat = (aVar5 - aVar4) + p->timeSatSat;
      p->nCallsSat = p->nCallsSat + 1;
      p_local._4_4_ = 0;
    }
    else {
      aVar5 = Abc_Clock();
      p->timeSatUndec = (aVar5 - aVar4) + p->timeSatUndec;
      p->nCallsUndec = p->nCallsUndec + 1;
      p_local._4_4_ = -1;
    }
    return p_local._4_4_;
  }
  __assert_fail("Aig_Regular(pGate) != pMiter",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cgt/cgtSat.c"
                ,0x38,"int Cgt_CheckImplication(Cgt_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////


/**Function*************************************************************

  Synopsis    [Runs equivalence test for the two nodes.]

  Description [Both nodes should be regular and different from each other.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Cgt_CheckImplication( Cgt_Man_t * p, Aig_Obj_t * pGate, Aig_Obj_t * pMiter )
{
    int nBTLimit = p->pPars->nConfMax;
    int pLits[2], RetValue;
    abctime clk;
    p->nCalls++;

    // sanity checks
    assert( p->pSat && p->pCnf );
    assert( !Aig_IsComplement(pMiter) );
    assert( Aig_Regular(pGate) != pMiter );

    // solve under assumptions
    // G => !M -- true     G & M -- false
    pLits[0] = toLitCond( p->pCnf->pVarNums[Aig_Regular(pGate)->Id], Aig_IsComplement(pGate) );
    pLits[1] = toLitCond( p->pCnf->pVarNums[pMiter->Id], 0 );

clk = Abc_Clock();
    RetValue = sat_solver_solve( p->pSat, pLits, pLits + 2, (ABC_INT64_T)nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
p->timeSat += Abc_Clock() - clk;
    if ( RetValue == l_False )
    {
p->timeSatUnsat += Abc_Clock() - clk;
        pLits[0] = lit_neg( pLits[0] );
        pLits[1] = lit_neg( pLits[1] );
        RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 2 );
        assert( RetValue );
        sat_solver_compress( p->pSat );
        p->nCallsUnsat++;
        return 1;
    }
    else if ( RetValue == l_True )
    {
p->timeSatSat += Abc_Clock() - clk;
        p->nCallsSat++;
        return 0;
    }
    else // if ( RetValue1 == l_Undef )
    {
p->timeSatUndec += Abc_Clock() - clk;
        p->nCallsUndec++;
        return -1;
    }
    return -2;
}